

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O1

bool loadSceneFramebuffer(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  bool bVar3;
  
  fwrite("Loading {Scene-Framebuffer}\n",0x1c,1,_stdout);
  fflush(_stdout);
  GVar1 = (*glad_glIsFramebuffer)(g_gl.framebuffers[1]);
  if (GVar1 != '\0') {
    (*glad_glDeleteFramebuffers)(1,g_gl.framebuffers + 1);
  }
  (*glad_glGenFramebuffers)(1,g_gl.framebuffers + 1);
  (*glad_glBindFramebuffer)(0x8d40,g_gl.framebuffers[1]);
  GVar2 = 0xde1;
  if (g_framebuffer.aa - 1U < 4) {
    GVar2 = 0x9100;
  }
  (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,GVar2,g_gl.textures[1],0);
  (*glad_glFramebufferTexture2D)(0x8d40,0x821a,GVar2,g_gl.textures[2],0);
  (*glad_glDrawBuffer)(0x8ce0);
  GVar2 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar2 == 0x8cd5) {
    (*glad_glBindFramebuffer)(0x8d40,0);
    GVar2 = (*glad_glGetError)();
    bVar3 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool loadSceneFramebuffer()
{
    LOG("Loading {Scene-Framebuffer}\n");
    if (glIsFramebuffer(g_gl.framebuffers[FRAMEBUFFER_SCENE]))
        glDeleteFramebuffers(1, &g_gl.framebuffers[FRAMEBUFFER_SCENE]);

    glGenFramebuffers(1, &g_gl.framebuffers[FRAMEBUFFER_SCENE]);
    glBindFramebuffer(GL_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_SCENE]);

    if (g_framebuffer.aa >= AA_MSAA2 && g_framebuffer.aa <= AA_MSAA16) {
        glFramebufferTexture2D(GL_FRAMEBUFFER,
                               GL_COLOR_ATTACHMENT0,
                               GL_TEXTURE_2D_MULTISAMPLE,
                               g_gl.textures[TEXTURE_SCENE],
                               0);
        glFramebufferTexture2D(GL_FRAMEBUFFER,
                               GL_DEPTH_STENCIL_ATTACHMENT,
                               GL_TEXTURE_2D_MULTISAMPLE,
                               g_gl.textures[TEXTURE_Z],
                               0);
    } else {
        glFramebufferTexture2D(GL_FRAMEBUFFER,
                               GL_COLOR_ATTACHMENT0,
                               GL_TEXTURE_2D,
                               g_gl.textures[TEXTURE_SCENE],
                               0);
        glFramebufferTexture2D(GL_FRAMEBUFFER,
                               GL_DEPTH_STENCIL_ATTACHMENT,
                               GL_TEXTURE_2D,
                               g_gl.textures[TEXTURE_Z],
                               0);
    }

    glDrawBuffer(GL_COLOR_ATTACHMENT0);
    if (GL_FRAMEBUFFER_COMPLETE != glCheckFramebufferStatus(GL_FRAMEBUFFER)) {
        LOG("=> Failure <=\n");

        return false;
    }

    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    return (glGetError() == GL_NO_ERROR);
}